

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirDEFDEVICE(void)

{
  value_type pCVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  CDeviceDef *this;
  reference ppCVar3;
  int local_590;
  int local_58c;
  int32_t i_1;
  int previous_page;
  CDeviceDef *dev;
  CDeviceDef *local_570;
  ulong local_568;
  size_t i;
  aint *initial_pages;
  aint *page_count;
  aint *slot_size;
  bool optional [258];
  aint local_438 [2];
  aint args [258];
  char *pcStack_10;
  bool is_defined;
  char *id;
  
  pcStack_10 = GetID(&lp);
  if (pcStack_10 == (char *)0x0) {
    Error(DEFDEVICE_SYNTAX_ERR,bp,SUPPRESS);
  }
  else {
    __first = std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>::begin(&DefDevices);
    __last = std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>::end(&DefDevices);
    args._1024_8_ = &stack0xfffffffffffffff0;
    bVar2 = std::
            any_of<__gnu_cxx::__normal_iterator<CDeviceDef**,std::vector<CDeviceDef*,std::allocator<CDeviceDef*>>>,dirDEFDEVICE()::__0>
                      ((__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                        )__first._M_current,
                       (__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                        )__last._M_current,(anon_class_8_1_3fcf65d9_for__M_pred)args._1024_8_);
    if ((bVar2) || (1 < pass)) {
      if (pass < 2) {
        Error("[DEFDEVICE] device with such ID is already defined",pcStack_10,EARLY);
      }
      SkipToEol(&lp);
    }
    else {
      memset(local_438,0,0x408);
      memset(&slot_size,0,0x102);
      page_count = local_438;
      initial_pages = local_438 + 1;
      i = (size_t)args;
      for (local_568 = 2; local_568 < 0x100; local_568 = local_568 + 1) {
        local_438[local_568] = -1;
        optional[local_568 - 8] = true;
      }
      bVar2 = anyComma(&lp);
      if ((bVar2) &&
         (bVar2 = getIntArguments<258>(&lp,(aint (*) [258])local_438,(bool (*) [258])&slot_size),
         bVar2)) {
        if ((*page_count < 0x100) || ((0x10000 < *page_count || (*initial_pages < 1)))) {
          Error("[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more",bp,EARLY);
        }
        else {
          this = (CDeviceDef *)operator_new(0x418);
          CDeviceDef::CDeviceDef(this,pcStack_10,*page_count,*initial_pages);
          local_570 = this;
          std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>::push_back
                    (&DefDevices,&local_570);
          ppCVar3 = std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>::back(&DefDevices);
          pCVar1 = *ppCVar3;
          local_58c = -1;
          for (local_590 = 0; local_590 < pCVar1->SlotsCount; local_590 = local_590 + 1) {
            if ((*(int *)(i + (long)local_590 * 4) < 0) ||
               (pCVar1->PagesCount <= *(int *)(i + (long)local_590 * 4))) {
              if (*(int *)(i + (long)local_590 * 4) != -1) {
                ErrorInt("[DEFDEVICE] invalid initial page",*(aint *)(i + (long)local_590 * 4),EARLY
                        );
              }
              if (local_58c < pCVar1->PagesCount + -1) {
                local_58c = local_58c + 1;
              }
            }
            else {
              local_58c = *(int *)(i + (long)local_590 * 4);
            }
            pCVar1->initialPages[local_590] = local_58c;
          }
        }
      }
      else {
        Error(DEFDEVICE_SYNTAX_ERR,bp,EARLY);
      }
    }
  }
  return;
}

Assistant:

static void dirDEFDEVICE() {
	//DEFDEVICE <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]
	const char* id = GetID(lp);
	if (!id) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, SUPPRESS);
		return;
	}

	const bool is_defined = std::any_of(
		DefDevices.begin(), DefDevices.end(),
		[&](const CDeviceDef* el) { return 0 == strcasecmp(id, el->getID()); }
	);
	if (is_defined || 1 < pass) {
		// same id defined twice during first pass?
		if (pass <= 1) Error("[DEFDEVICE] device with such ID is already defined", id, EARLY);
		// in later passes ignore the line, DEFDEVICE works only in first pass
		SkipToEol(lp);
		return;
	}

	// add new definition if arguments are correct and this is first pass
	aint args[2 + CDeviceDef::MAX_SLOT_N] = {};	// slot_size, page_count, initial pages, ...
	bool optional[2 + CDeviceDef::MAX_SLOT_N] = {false, false};
	aint &slot_size = args[0], &page_count = args[1], *initial_pages = args + 2;
	for (size_t i = 2; i < CDeviceDef::MAX_SLOT_N; ++i) {
		args[i] = -1;
		optional[i] = true;
	}
	if (!anyComma(lp) || !getIntArguments<2 + CDeviceDef::MAX_SLOT_N>(lp, args, optional)) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, EARLY);
		return;
	}
	if (slot_size < 256 || 0x10000 < slot_size || page_count <= 0) {
		Error("[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more", bp, EARLY);
		return;
	}
	DefDevices.push_back(new CDeviceDef(id, slot_size, page_count));

	// init "initialPages array by going 0, 1, 2, ..., page_count-1, page_count-1, ... or parsed explicit values
	CDeviceDef & dev = *DefDevices.back();
	int previous_page = -1;
	for (int32_t i = 0; i < dev.SlotsCount; ++i) {
		if (0 <= initial_pages[i] && initial_pages[i] < dev.PagesCount) {
			previous_page = initial_pages[i];
		} else {
			if (-1 != initial_pages[i]) ErrorInt("[DEFDEVICE] invalid initial page", initial_pages[i], EARLY);
			if (previous_page < dev.PagesCount - 1) ++previous_page;
		}
		dev.initialPages[i] = previous_page;
	}
}